

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O1

Node * prvTidyInsertedToken(TidyDocImpl *doc)

{
  Lexer *lexer;
  StreamIn *pSVar1;
  uint uVar2;
  Node *pNVar3;
  tmbstr ptVar4;
  AttVal *pAVar5;
  IStack *pIVar6;
  
  lexer = doc->lexer;
  pNVar3 = lexer->inode;
  if (lexer->insert == (IStack *)0x0) {
    lexer->inode = (Node *)0x0;
  }
  else {
    if (pNVar3 == (Node *)0x0) {
      pSVar1 = doc->docIn;
      lexer->lines = pSVar1->curline;
      lexer->columns = pSVar1->curcol;
    }
    pNVar3 = prvTidyNewNode(doc->allocator,lexer);
    pNVar3->type = StartTag;
    pNVar3->implicit = yes;
    pNVar3->start = lexer->txtstart;
    pNVar3->end = lexer->txtend;
    pIVar6 = lexer->insert;
    ptVar4 = prvTidytmbstrdup(doc->allocator,pIVar6->element);
    pNVar3->element = ptVar4;
    pNVar3->tag = pIVar6->tag;
    pAVar5 = prvTidyDupAttrs(doc,pIVar6->attributes);
    pNVar3->attributes = pAVar5;
    uVar2 = (int)((ulong)((long)lexer->insert - (long)lexer->istack) >> 5) + 1;
    pIVar6 = (IStack *)0x0;
    if (uVar2 < lexer->istacksize) {
      pIVar6 = lexer->istack + uVar2;
    }
    lexer->insert = pIVar6;
  }
  return pNVar3;
}

Assistant:

Node *TY_(InsertedToken)( TidyDocImpl* doc )
{
    Lexer* lexer = doc->lexer;
    Node *node;
    IStack *istack;
    uint n;

    /* this will only be NULL if inode != NULL */
    if (lexer->insert == NULL)
    {
        node = lexer->inode;
        lexer->inode = NULL;
        return node;
    }

    /*
      If this is the "latest" node then update
      the position, otherwise use current values
    */

    if (lexer->inode == NULL)
    {
        lexer->lines = doc->docIn->curline;
        lexer->columns = doc->docIn->curcol;
    }

    node = TY_(NewNode)(doc->allocator, lexer);
    node->type = StartTag;
    node->implicit = yes;
    node->start = lexer->txtstart;
    /* #431734 [JTidy bug #226261 (was 126261)] - fix by Gary Peskin 20 Dec 00 */ 
    node->end = lexer->txtend; /* was : lexer->txtstart; */
    istack = lexer->insert;

/* #if 0 && defined(_DEBUG) */
#if definedENABLE_DEBUG_LOG
    if ( lexer->istacksize == 0 )
    {
        SPRTF( "WARNING: ZERO sized istack!\n" );
    }
#endif

    node->element = TY_(tmbstrdup)(doc->allocator, istack->element);
    node->tag = istack->tag;
    node->attributes = TY_(DupAttrs)( doc, istack->attributes );

    /* advance lexer to next item on the stack */
    n = (uint)(lexer->insert - &(lexer->istack[0]));

    /* and recover state if we have reached the end */
    if (++n < lexer->istacksize)
        lexer->insert = &(lexer->istack[n]);
    else
        lexer->insert = NULL;

    return node;
}